

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InertiaNonLinearParametrization.cpp
# Opt level: O0

void __thiscall
iDynTree::RigidBodyInertiaNonLinearParametrization::fromRigidBodyInertia
          (RigidBodyInertiaNonLinearParametrization *this,SpatialInertia *inertia)

{
  double dVar1;
  double dVar2;
  CoeffReturnType pdVar3;
  double *pdVar4;
  MatrixUType *this_00;
  SpatialInertia *in_RSI;
  double *in_RDI;
  double dVar5;
  double dVar6;
  MatrixFixSize<3U,_3U> *mat;
  uint in_stack_0000004c;
  MatrixType *in_stack_00000050;
  JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2> *in_stack_00000058;
  double Czz;
  double Cyy;
  double Cxx;
  double Izz;
  double Iyy;
  double Ixx;
  JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2> eigenValuesSolver;
  RotationalInertia inertiaAtCOM;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffffce8;
  SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_> *in_stack_fffffffffffffcf0;
  JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2> *in_stack_fffffffffffffd00;
  MatrixFixSize<3U,_3U> *in_stack_fffffffffffffd08;
  SpatialInertia *in_stack_fffffffffffffd18;
  SpatialInertia *in_stack_fffffffffffffe18;
  Position local_28;
  
  dVar5 = SpatialInertia::getMass(in_RSI);
  *in_RDI = dVar5;
  SpatialInertia::getCenterOfMass(in_stack_fffffffffffffd18);
  Position::operator=((Position *)(in_RDI + 1),&local_28);
  SpatialInertia::getRotationalInertiaWrtCenterOfMass(in_stack_fffffffffffffe18);
  Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>::JacobiSVD(in_stack_fffffffffffffd00);
  toEigen<3u,3u>(in_stack_fffffffffffffd08);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>
            (&in_stack_fffffffffffffcf0->m_matrixU,
             (EigenBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffffce8);
  Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>::compute
            (in_stack_00000058,in_stack_00000050,in_stack_0000004c);
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>::singularValues
            (in_stack_fffffffffffffcf0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)
                      in_stack_fffffffffffffcf0,(Index)in_stack_fffffffffffffce8);
  dVar5 = *pdVar3;
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>::singularValues
            (in_stack_fffffffffffffcf0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)
                      in_stack_fffffffffffffcf0,(Index)in_stack_fffffffffffffce8);
  dVar1 = *pdVar3;
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>::singularValues
            (in_stack_fffffffffffffcf0);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)
                      in_stack_fffffffffffffcf0,(Index)in_stack_fffffffffffffce8);
  dVar2 = *pdVar3;
  dVar6 = ((dVar1 + dVar2) - dVar5) * 0.5;
  mat = (MatrixFixSize<3U,_3U> *)(((dVar5 + dVar2) - dVar1) * 0.5);
  pdVar4 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0xd),0);
  *pdVar4 = dVar6;
  pdVar4 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0xd),1);
  *pdVar4 = (double)mat;
  pdVar4 = VectorFixSize<3U>::operator()((VectorFixSize<3U> *)(in_RDI + 0xd),2);
  *pdVar4 = ((dVar5 + dVar1) - dVar2) * 0.5;
  this_00 = Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>::matrixU
                      (in_stack_fffffffffffffcf0);
  toEigen<3u,3u>(mat);
  Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)this_00,
             in_stack_fffffffffffffce8);
  Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>::~JacobiSVD
            ((JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2> *)0x6a1a1a);
  return;
}

Assistant:

void RigidBodyInertiaNonLinearParametrization::fromRigidBodyInertia(const SpatialInertia& inertia)
{
    using namespace Eigen;

    // We get the mass and the center of mass
    this->mass = inertia.getMass();

    this->com = inertia.getCenterOfMass();

    // We get the inertia at the COM
    RotationalInertia inertiaAtCOM = inertia.getRotationalInertiaWrtCenterOfMass();

    // We get the inertia at the principal axis using eigen
    JacobiSVD<Matrix<double,3,3,RowMajor> > eigenValuesSolver;

    // We check both the positive definitiveness of the matrix and the triangle
    // inequality by directly checking the central second moment of mass of the rigid body
    // In a nutshell, we have that:
    // Ixx = Cyy + Czz
    // Iyy = Cxx + Czz
    // Izz = Cxx + Cyy
    // so
    // Cxx = (Iyy + Izz - Ixx)/2
    // Cyy = (Ixx + Izz - Iyy)/2
    // Czz = (Ixx + Iyy - Izz)/2
    // Then all the condition boils down to:
    // Cxx >= 0 , Cyy >= 0 , Czz >= 0
    eigenValuesSolver.compute( toEigen(inertiaAtCOM) , Eigen::ComputeFullU | Eigen::ComputeFullV);

    double Ixx = eigenValuesSolver.singularValues()(0);
    double Iyy = eigenValuesSolver.singularValues()(1);
    double Izz = eigenValuesSolver.singularValues()(2);

    double Cxx = (Iyy + Izz - Ixx)/2;
    double Cyy = (Ixx + Izz - Iyy)/2;
    double Czz = (Ixx + Iyy - Izz)/2;

    this->centralSecondMomentOfMass(0) = Cxx;
    this->centralSecondMomentOfMass(1) = Cyy;
    this->centralSecondMomentOfMass(2) = Czz;

    toEigen(this->link_R_centroidal) = eigenValuesSolver.matrixU();
}